

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

EndianKind __thiscall llvm::ARM::parseArchEndian(ARM *this,StringRef Arch)

{
  char *pcVar1;
  iterator pcVar2;
  bool bVar3;
  bool bVar4;
  bool local_299;
  undefined1 local_218 [8];
  StringRef Arch_local;
  int local_cc;
  int local_ac;
  int local_8c;
  int local_6c;
  int local_4c;
  int local_2c;
  int local_c;
  
  Arch_local.Data = Arch.Data;
  local_218 = (undefined1  [8])this;
  pcVar1 = (char *)strlen("armeb");
  local_299 = false;
  if (pcVar1 <= Arch_local.Data) {
    if (pcVar1 == (char *)0x0) {
      local_ac = 0;
    }
    else {
      local_ac = memcmp((void *)local_218,"armeb",(size_t)pcVar1);
    }
    local_299 = local_ac == 0;
  }
  bVar4 = true;
  if (!local_299) {
    pcVar1 = (char *)strlen("thumbeb");
    bVar3 = false;
    if (pcVar1 <= Arch_local.Data) {
      if (pcVar1 == (char *)0x0) {
        local_8c = 0;
      }
      else {
        local_8c = memcmp((void *)local_218,"thumbeb",(size_t)pcVar1);
      }
      bVar3 = local_8c == 0;
    }
    bVar4 = true;
    if (!bVar3) {
      pcVar1 = (char *)strlen("aarch64_be");
      bVar4 = false;
      if (pcVar1 <= Arch_local.Data) {
        if (pcVar1 == (char *)0x0) {
          local_6c = 0;
        }
        else {
          local_6c = memcmp((void *)local_218,"aarch64_be",(size_t)pcVar1);
        }
        bVar4 = local_6c == 0;
      }
    }
  }
  if (bVar4) {
    Arch_local.Length._4_4_ = BIG;
  }
  else {
    pcVar1 = (char *)strlen("arm");
    bVar4 = false;
    if (pcVar1 <= Arch_local.Data) {
      if (pcVar1 == (char *)0x0) {
        local_4c = 0;
      }
      else {
        local_4c = memcmp((void *)local_218,"arm",(size_t)pcVar1);
      }
      bVar4 = local_4c == 0;
    }
    bVar3 = true;
    if (!bVar4) {
      pcVar1 = (char *)strlen("thumb");
      bVar3 = false;
      if (pcVar1 <= Arch_local.Data) {
        if (pcVar1 == (char *)0x0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp((void *)local_218,"thumb",(size_t)pcVar1);
        }
        bVar3 = local_2c == 0;
      }
    }
    if (bVar3) {
      pcVar1 = (char *)strlen("eb");
      bVar4 = false;
      if (pcVar1 <= Arch_local.Data) {
        pcVar2 = StringRef::end((StringRef *)local_218);
        if (pcVar1 == (char *)0x0) {
          local_cc = 0;
        }
        else {
          local_cc = memcmp(pcVar2 + -(long)pcVar1,"eb",(size_t)pcVar1);
        }
        bVar4 = local_cc == 0;
      }
      if (bVar4) {
        Arch_local.Length._4_4_ = BIG;
      }
      else {
        Arch_local.Length._4_4_ = LITTLE;
      }
    }
    else {
      pcVar1 = (char *)strlen("aarch64");
      bVar4 = false;
      if (pcVar1 <= Arch_local.Data) {
        if (pcVar1 == (char *)0x0) {
          local_c = 0;
        }
        else {
          local_c = memcmp((void *)local_218,"aarch64",(size_t)pcVar1);
        }
        bVar4 = local_c == 0;
      }
      if (bVar4) {
        Arch_local.Length._4_4_ = LITTLE;
      }
      else {
        Arch_local.Length._4_4_ = INVALID;
      }
    }
  }
  return Arch_local.Length._4_4_;
}

Assistant:

ARM::EndianKind ARM::parseArchEndian(StringRef Arch) {
  if (Arch.startswith("armeb") || Arch.startswith("thumbeb") ||
      Arch.startswith("aarch64_be"))
    return ARM::EndianKind::BIG;

  if (Arch.startswith("arm") || Arch.startswith("thumb")) {
    if (Arch.endswith("eb"))
      return ARM::EndianKind::BIG;
    else
      return ARM::EndianKind::LITTLE;
  }

  if (Arch.startswith("aarch64"))
    return ARM::EndianKind::LITTLE;

  return ARM::EndianKind::INVALID;
}